

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightdata.cpp
# Opt level: O3

void gl_SetShaderLight(float level,float olight)

{
  float fVar1;
  
  gl_RenderState.mLightParms[0] = 0.0;
  if (level <= 0.0) {
    gl_RenderState.mLightParms[1] = 1.0;
  }
  else {
    if (olight < 96.0) {
      fVar1 = olight * 1.3333334 + 128.0;
    }
    else {
      fVar1 = 256.0;
    }
    gl_RenderState.mLightParms[1] =
         (float)(~-(uint)(olight < 96.0) & (uint)(olight * 0.75) |
                -(uint)(olight < 96.0) & 0x42900000) / level + 0.25;
    gl_RenderState.mLightParms[0] =
         (float)(~-(uint)(gl_RenderState.mLightParms[1] == 1.0) & (uint)fVar1);
  }
  return;
}

Assistant:

void gl_SetShaderLight(float level, float olight)
{
	const float MAXDIST = 256.f;
	const float THRESHOLD = 96.f;
	const float FACTOR = 0.75f;

	if (level > 0)
	{
		float lightdist, lightfactor;
			
		if (olight < THRESHOLD)
		{
			lightdist = (MAXDIST/2) + (olight * MAXDIST / THRESHOLD / 2);
			olight = THRESHOLD;
		}
		else lightdist = MAXDIST;

		lightfactor = 1.f + ((olight/level) - 1.f) * FACTOR;
		if (lightfactor == 1.f) lightdist = 0.f;	// save some code in the shader
		gl_RenderState.SetLightParms(lightfactor, lightdist);
	}
	else
	{
		gl_RenderState.SetLightParms(1.f, 0.f);
	}
}